

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

string_view google::protobuf::internal::ShortEditionName(Edition edition)

{
  EnumDescriptor *descriptor;
  string *psVar1;
  ulong uVar2;
  long *plVar3;
  string_view sVar4;
  
  descriptor = Edition_descriptor();
  psVar1 = NameOfEnum_abi_cxx11_(descriptor,edition);
  plVar3 = (long *)(psVar1->_M_dataplus)._M_p;
  uVar2 = psVar1->_M_string_length;
  if ((7 < uVar2) && (*plVar3 == 0x5f4e4f4954494445)) {
    plVar3 = plVar3 + 1;
    uVar2 = uVar2 - 8;
  }
  sVar4._M_str = (char *)plVar3;
  sVar4._M_len = uVar2;
  return sVar4;
}

Assistant:

absl::string_view ShortEditionName(Edition edition) {
  return absl::StripPrefix(Edition_Name(edition), "EDITION_");
}